

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_assignUnitsItemIdBadInput_Test::TestBody(Annotator_assignUnitsItemIdBadInput_Test *this)

{
  char *pcVar1;
  shared_ptr asStack_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  AnnotatorPtr annotator;
  
  libcellml::Annotator::create();
  local_38 = 0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::UnitsItem::create(asStack_78,(ulong)&local_38);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_58);
  pcVar1 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"",
             "annotator->assignId(libcellml::UnitsItem::create(nullptr, 0))",(char (*) [1])0x153c1a,
             &local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)asStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x484,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)asStack_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)asStack_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_38 = 0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::UnitsItem::create(asStack_78,(ulong)&local_38);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_58);
  pcVar1 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"",
             "annotator->assignId(libcellml::UnitsItem::create(nullptr, std::numeric_limits<size_t>::max()))"
             ,(char (*) [1])0x153c1a,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)asStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x485,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)asStack_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)asStack_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Annotator, assignUnitsItemIdBadInput)
{
    auto annotator = libcellml::Annotator::create();
    EXPECT_EQ("", annotator->assignId(libcellml::UnitsItem::create(nullptr, 0)));
    EXPECT_EQ("", annotator->assignId(libcellml::UnitsItem::create(nullptr, std::numeric_limits<size_t>::max())));
}